

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O0

void __thiscall
Engine_testObserveDoubleTagsVector_Test::TestBody(Engine_testObserveDoubleTagsVector_Test *this)

{
  bool bVar1;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *this_00;
  pointer pHVar2;
  char *pcVar3;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  value_type im;
  AssertionResult gtest_ar;
  TestHandler *th;
  value_type *h;
  vector<Tag,_std::allocator<Tag>_> tags;
  Engine e;
  string *in_stack_fffffffffffffbd8;
  undefined7 in_stack_fffffffffffffbe0;
  undefined1 in_stack_fffffffffffffbe7;
  vector<Tag,_std::allocator<Tag>_> *in_stack_fffffffffffffbe8;
  undefined7 in_stack_fffffffffffffbf0;
  undefined1 in_stack_fffffffffffffbf7;
  Measure<double> *in_stack_fffffffffffffbf8;
  int line;
  undefined7 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc07;
  undefined1 uVar4;
  undefined8 in_stack_fffffffffffffc08;
  Type type;
  undefined7 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc17;
  undefined1 uVar5;
  size_type in_stack_fffffffffffffc18;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  char *in_stack_fffffffffffffc28;
  undefined7 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc37;
  Message *in_stack_fffffffffffffc58;
  undefined7 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc67;
  undefined1 uVar6;
  long local_388;
  AssertionResult local_320 [2];
  AssertionResult local_300 [2];
  AssertionResult local_2e0 [2];
  AssertionResult local_2c0 [2];
  size_type local_2a0;
  undefined4 local_294;
  AssertionResult local_290 [2];
  undefined8 local_270;
  AssertionResult local_268 [2];
  undefined4 local_244;
  AssertionResult local_240 [2];
  undefined4 local_21c;
  AssertionResult local_218 [2];
  AssertionResult local_1f8 [5];
  vector<Tag,_std::allocator<Tag>_> local_1a8;
  uint local_18c;
  size_type local_178;
  undefined4 local_16c;
  AssertionResult local_168;
  long local_158;
  const_reference local_150;
  undefined8 local_148;
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [88];
  Engine local_40;
  
  type = (Type)((ulong)in_stack_fffffffffffffc08 >> 0x20);
  std::make_unique<TestHandler>();
  std::unique_ptr<Handler,std::default_delete<Handler>>::
  unique_ptr<TestHandler,std::default_delete<TestHandler>,void>
            ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
             CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
             (unique_ptr<TestHandler,_std::default_delete<TestHandler>_> *)in_stack_fffffffffffffbe8
            );
  Engine::Engine((Engine *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                 in_stack_fffffffffffffc28,
                 (unique_ptr<Handler,_std::default_delete<Handler>_> *)
                 CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
  std::unique_ptr<Handler,_std::default_delete<Handler>_>::~unique_ptr
            ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
             CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
  std::unique_ptr<TestHandler,_std::default_delete<TestHandler>_>::~unique_ptr
            ((unique_ptr<TestHandler,_std::default_delete<TestHandler>_> *)
             CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
  std::vector<Tag,_std::allocator<Tag>_>::vector((vector<Tag,_std::allocator<Tag>_> *)0x12c26e);
  std::vector<Tag,_std::allocator<Tag>_>::reserve
            ((vector<Tag,_std::allocator<Tag>_> *)
             CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),in_stack_fffffffffffffc18
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"Foo",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"Bar",&local_c1);
  Tag::appendTag((vector<Tag,_std::allocator<Tag>_> *)
                 CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                 in_stack_fffffffffffffbd8,(string *)0x12c305);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"Hello",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"World",&local_111);
  Tag::appendTag((vector<Tag,_std::allocator<Tag>_> *)
                 CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                 in_stack_fffffffffffffbd8,(string *)0x12c3be);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"histo.value",&local_139);
  local_148 = 0x405900083126e979;
  Engine::Observe<double,_nullptr>
            ((Engine *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
             (string *)in_stack_fffffffffffffbf8,
             (double *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
             in_stack_fffffffffffffbe8);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  this_00 = Engine::GetHandlers(&local_40);
  local_150 = std::
              vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
              ::operator[](this_00,0);
  pHVar2 = std::unique_ptr<Handler,_std::default_delete<Handler>_>::get
                     ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
                      CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
  if (pHVar2 == (pointer)0x0) {
    local_388 = 0;
  }
  else {
    local_388 = __dynamic_cast(pHVar2,&Handler::typeinfo,&TestHandler::typeinfo,0);
  }
  local_158 = local_388;
  local_16c = 1;
  local_178 = std::vector<Measure<double>,_std::allocator<Measure<double>_>_>::size
                        ((vector<Measure<double>,_std::allocator<Measure<double>_>_> *)
                         (local_388 + 0x20));
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((char *)in_stack_fffffffffffffbf8,
             (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
             (int *)in_stack_fffffffffffffbe8,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_168);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
    testing::AssertionResult::failure_message((AssertionResult *)0x12c746);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),type,
               (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
               (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
               in_stack_fffffffffffffc58);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
    testing::Message::~Message((Message *)0x12c7a9);
  }
  local_18c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12c817);
  if (local_18c == 0) {
    std::vector<Measure<double>,_std::allocator<Measure<double>_>_>::operator[]
              ((vector<Measure<double>,_std::allocator<Measure<double>_>_> *)(local_158 + 0x20),0);
    Measure<double>::Measure
              ((Measure<double> *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
               in_stack_fffffffffffffbf8);
    testing::internal::EqHelper<false>::Compare<char[17],std::__cxx11::string>
              ((char *)in_stack_fffffffffffffbf8,
               (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
               (char (*) [17])in_stack_fffffffffffffbe8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1f8);
    uVar6 = bVar1;
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
      in_stack_fffffffffffffc58 =
           (Message *)testing::AssertionResult::failure_message((AssertionResult *)0x12c903);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),type,
                 (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                 (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc60),in_stack_fffffffffffffc58
                );
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
      testing::Message::~Message((Message *)0x12c966);
    }
    local_18c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x12c9d4);
    if (local_18c == 0) {
      local_21c = 2;
      testing::internal::EqHelper<false>::Compare<MetricTypes::MetricType,MetricTypes::MetricType>
                ((char *)in_stack_fffffffffffffbf8,
                 (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                 (MetricType *)in_stack_fffffffffffffbe8,
                 (MetricType *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_218);
      if (!bVar1) {
        testing::Message::Message
                  ((Message *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
        testing::AssertionResult::failure_message((AssertionResult *)0x12ca86);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                   type,(char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                   (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc60),
                   in_stack_fffffffffffffc58);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
        testing::Message::~Message((Message *)0x12cae3);
      }
      local_18c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12cb51);
      if (local_18c == 0) {
        local_244 = 1;
        testing::internal::EqHelper<false>::Compare<int,float>
                  ((char *)in_stack_fffffffffffffbf8,
                   (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                   (int *)in_stack_fffffffffffffbe8,
                   (float *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_240);
        if (!bVar1) {
          testing::Message::Message
                    ((Message *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
          testing::AssertionResult::failure_message((AssertionResult *)0x12cc03);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                     type,(char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                     (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                     (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc60),
                     in_stack_fffffffffffffc58);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
          testing::Message::~Message((Message *)0x12cc60);
        }
        local_18c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x12ccce);
        if (local_18c == 0) {
          local_270 = 0x405900083126e979;
          testing::internal::EqHelper<false>::Compare<double,double>
                    ((char *)in_stack_fffffffffffffbf8,
                     (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                     (double *)in_stack_fffffffffffffbe8,
                     (double *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_268);
          if (!bVar1) {
            testing::Message::Message
                      ((Message *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
            testing::AssertionResult::failure_message((AssertionResult *)0x12cd87);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10)
                       ,type,(char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                       (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                       (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc60),
                       in_stack_fffffffffffffc58);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0)
                      );
            testing::Message::~Message((Message *)0x12cde4);
          }
          local_18c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x12ce52);
          if (local_18c == 0) {
            local_294 = 2;
            local_2a0 = std::vector<Tag,_std::allocator<Tag>_>::size(&local_1a8);
            testing::internal::EqHelper<false>::Compare<int,unsigned_long>
                      ((char *)in_stack_fffffffffffffbf8,
                       (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                       (int *)in_stack_fffffffffffffbe8,
                       (unsigned_long *)
                       CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_290);
            if (!bVar1) {
              testing::Message::Message
                        ((Message *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
              testing::AssertionResult::failure_message((AssertionResult *)0x12cf19);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)
                         CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),type,
                         (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                         (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                         (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc60),
                         in_stack_fffffffffffffc58);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)
                         CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
              testing::Message::~Message((Message *)0x12cf76);
            }
            local_18c = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x12cfe4);
            if (local_18c == 0) {
              std::vector<Tag,_std::allocator<Tag>_>::operator[](&local_1a8,0);
              testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
                        ((char *)in_stack_fffffffffffffbf8,
                         (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                         (char (*) [4])in_stack_fffffffffffffbe8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
              bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2c0);
              uVar5 = bVar1;
              if (!bVar1) {
                testing::Message::Message((Message *)CONCAT17(bVar1,in_stack_fffffffffffffc10));
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x12d096);
                type = (Type)((ulong)pcVar3 >> 0x20);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)CONCAT17(uVar5,in_stack_fffffffffffffc10),type,
                           (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                           (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                           (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc60),
                           in_stack_fffffffffffffc58);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)
                           CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
                testing::Message::~Message((Message *)0x12d0f3);
              }
              local_18c = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x12d161);
              if (local_18c == 0) {
                std::vector<Tag,_std::allocator<Tag>_>::operator[](&local_1a8,0);
                testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
                          ((char *)in_stack_fffffffffffffbf8,
                           (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                           (char (*) [4])in_stack_fffffffffffffbe8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
                bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2e0);
                uVar4 = bVar1;
                if (!bVar1) {
                  testing::Message::Message((Message *)CONCAT17(uVar5,in_stack_fffffffffffffc10));
                  in_stack_fffffffffffffbf8 =
                       (Measure<double> *)
                       testing::AssertionResult::failure_message((AssertionResult *)0x12d217);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)CONCAT17(uVar5,in_stack_fffffffffffffc10),type,
                             (char *)CONCAT17(uVar4,in_stack_fffffffffffffc00),
                             (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                             (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc60),
                             in_stack_fffffffffffffc58);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)
                             CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
                  testing::Message::~Message((Message *)0x12d274);
                }
                local_18c = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x12d2e2);
                if (local_18c == 0) {
                  std::vector<Tag,_std::allocator<Tag>_>::operator[](&local_1a8,1);
                  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
                            ((char *)in_stack_fffffffffffffbf8,
                             (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                             (char (*) [6])in_stack_fffffffffffffbe8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
                  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_300);
                  in_stack_fffffffffffffbf7 = bVar1;
                  if (!bVar1) {
                    testing::Message::Message((Message *)CONCAT17(uVar5,in_stack_fffffffffffffc10));
                    in_stack_fffffffffffffbe8 =
                         (vector<Tag,_std::allocator<Tag>_> *)
                         testing::AssertionResult::failure_message((AssertionResult *)0x12d395);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)CONCAT17(uVar5,in_stack_fffffffffffffc10),type,
                               (char *)CONCAT17(uVar4,in_stack_fffffffffffffc00),
                               (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                               (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0)
                              );
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc60),
                               in_stack_fffffffffffffc58);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)
                               CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
                    testing::Message::~Message((Message *)0x12d3f2);
                  }
                  local_18c = (uint)!bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12d460);
                  if (local_18c == 0) {
                    std::vector<Tag,_std::allocator<Tag>_>::operator[](&local_1a8,1);
                    testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
                              ((char *)in_stack_fffffffffffffbf8,
                               (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0)
                               ,(char (*) [6])in_stack_fffffffffffffbe8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
                    line = (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_320);
                    in_stack_fffffffffffffbe7 = bVar1;
                    if (!bVar1) {
                      testing::Message::Message
                                ((Message *)CONCAT17(uVar5,in_stack_fffffffffffffc10));
                      testing::AssertionResult::failure_message((AssertionResult *)0x12d517);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)CONCAT17(uVar5,in_stack_fffffffffffffc10),type,
                                 (char *)CONCAT17(uVar4,in_stack_fffffffffffffc00),line,
                                 (char *)CONCAT17(in_stack_fffffffffffffbf7,
                                                  in_stack_fffffffffffffbf0));
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc60),
                                 in_stack_fffffffffffffc58);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)
                                 CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
                      testing::Message::~Message((Message *)0x12d572);
                    }
                    local_18c = (uint)!bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)0x12d5dd);
                    if (local_18c == 0) {
                      local_18c = 0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    Measure<double>::~Measure
              ((Measure<double> *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
  }
  std::vector<Tag,_std::allocator<Tag>_>::~vector
            ((vector<Tag,_std::allocator<Tag>_> *)
             CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
  Engine::~Engine((Engine *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
  return;
}

Assistant:

TEST(Engine, testObserveDoubleTagsVector) {
    Engine e("test", std::move(std::make_unique<TestHandler>()));
    std::vector<Tag> tags;
    tags.reserve(2);
    Tag::appendTag(tags, "Foo", "Bar");
    Tag::appendTag(tags, "Hello", "World");
    e.Observe("histo.value", 100.0005, tags);
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->doubleMeasures.size());
    auto im = th->doubleMeasures[0];
    ASSERT_EQ("test.histo.value", im.name);
    ASSERT_EQ(MetricType::Histogram, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(100.0005, im.value);
    ASSERT_EQ(2, im.tags.size());
    ASSERT_EQ("Foo", im.tags[0].name);
    ASSERT_EQ("Bar", im.tags[0].value);
    ASSERT_EQ("Hello", im.tags[1].name);
    ASSERT_EQ("World", im.tags[1].value);
}